

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Source *pSVar8;
  Lexem *pLVar9;
  undefined7 uVar11;
  ostream *poVar10;
  int i;
  long lVar12;
  byte *pbVar13;
  string *args_2;
  size_t sVar14;
  char **in_RDX;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char **extraout_RDX_04;
  char **extraout_RDX_05;
  char **extraout_RDX_06;
  char **extraout_RDX_07;
  char **extraout_RDX_08;
  char **extraout_RDX_09;
  char **extraout_RDX_10;
  char **extraout_RDX_11;
  char **extraout_RDX_12;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX_13;
  void *extraout_RDX_14;
  void *extraout_RDX_15;
  void *extraout_RDX_16;
  void *__buf_02;
  ulong uVar15;
  char **args;
  int iVar16;
  int iVar17;
  byte *pbVar18;
  char *pcVar19;
  byte bVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  string *str;
  pointer pbVar25;
  bool bVar26;
  Vec<const_char_*> lfc;
  Pool<Hpipe::Source,_32> source_pool;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> lfs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  disp;
  StreamSepMaker ss;
  int tmp;
  ErrorList error_list;
  Lexer lexer;
  CppEmitter ce;
  InstructionGraph ig;
  CharGraph cg;
  istringstream iss;
  uint local_ec4;
  byte *local_ec0;
  long *local_eb8;
  iterator iStack_eb0;
  char **local_ea8;
  byte *local_ea0;
  byte *local_e98;
  ulong local_e90;
  undefined8 local_e88;
  undefined8 local_e80;
  ulong local_e78;
  ulong local_e70;
  undefined8 local_e68;
  undefined8 local_e60;
  undefined8 local_e58;
  undefined8 local_e50;
  Pool<Hpipe::Source,_32> local_e48;
  string local_e38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e18;
  string local_e00;
  string local_de0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_dc0;
  StreamSepMaker local_da8;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_d20;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_cf0;
  string local_cc0 [16];
  ErrorList local_ac0;
  Lexer local_a30;
  CppEmitter local_900;
  StreamSep local_810;
  StreamSep local_7c8;
  StreamSep local_780;
  StreamSep local_738;
  StreamSep local_6f0;
  StreamSep local_6a8;
  StreamSep local_660;
  StreamSep local_618;
  StreamSep local_5d0;
  StreamSep local_588;
  StreamSep local_540;
  InstructionGraph local_4f8;
  CharGraph local_338;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  iVar7 = (int)in_RDX;
  if (1 < argc) {
    local_ec0 = (byte *)0x17b004;
    uVar23 = 0xffffffff;
    uVar15 = 1;
    iVar17 = 0;
    bVar5 = false;
    local_e78 = 0;
    local_e98 = (byte *)0x17c0d4;
    local_e80 = 0;
    local_ec4 = 0;
    local_ea0 = (byte *)0x0;
    local_e68 = 0;
    local_e60 = 0;
    local_e58 = 0;
    local_e50 = 0;
    local_e70 = 0;
    local_e90 = 0;
    local_e88 = 0;
LAB_0012edbf:
    iVar7 = (int)uVar15;
    pbVar18 = (byte *)argv[iVar7];
    iVar6 = iVar7;
    if (*pbVar18 == 0x2d) {
      bVar3 = pbVar18[1];
      if (bVar3 == 0x2d) {
        lVar12 = 0;
        do {
          bVar21 = pbVar18[lVar12 + 2];
          in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
          if ((bVar21 == 0) && ("disp_lexem_graph"[lVar12] == '\0')) {
            bVar5 = true;
            goto LAB_0012f258;
          }
          bVar20 = "disp_lexem_graph"[lVar12];
          if ("disp_lexem_graph"[lVar12] == 0x5f) {
            bVar20 = 0x2d;
          }
          lVar12 = lVar12 + 1;
        } while (bVar21 == bVar20);
        lVar12 = 0;
        do {
          bVar21 = pbVar18[lVar12 + 2];
          in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
          if ((bVar21 == 0) && ("disp_char_graph"[lVar12] == '\0')) {
            local_e78 = 1;
            goto LAB_0012f258;
          }
          bVar20 = "disp_char_graph"[lVar12];
          if (bVar20 == 0x5f) {
            bVar20 = 0x2d;
          }
          lVar12 = lVar12 + 1;
        } while (bVar21 == bVar20);
        lVar12 = 0;
        do {
          bVar21 = pbVar18[lVar12 + 2];
          in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
          if ((bVar21 == 0) && ("disp_inst_graph"[lVar12] == '\0')) {
            if (iVar7 + 1 < argc) {
              local_e98 = (byte *)argv[iVar7 + 1];
              in_RDX = argv;
              goto LAB_0012f24d;
            }
            printf("%s","Error: ");
            putchar(0x69);
            printf("%s"," or --");
            _preparg_dispu("disp_inst_graph");
            puts(" must be followed by an argument.\n");
            printf("%s","Try \'");
            pcVar19 = *argv;
            if (pcVar19 == (char *)0x0) {
              pcVar19 = "";
            }
            printf("%s",pcVar19);
            puts(" --help\' for more information.");
            iVar17 = 5;
            in_RDX = extraout_RDX_00;
            goto LAB_0012f338;
          }
          bVar20 = "disp_inst_graph"[lVar12];
          if (bVar20 == 0x5f) {
            bVar20 = 0x2d;
          }
          lVar12 = lVar12 + 1;
        } while (bVar21 == bVar20);
        lVar12 = 0;
LAB_0012ee66:
        bVar21 = pbVar18[lVar12 + 2];
        in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
        if ((bVar21 != 0) || ("disp_inst_pred"[lVar12] != '\0')) goto LAB_0012ee79;
        local_e80 = 1;
LAB_0012f258:
        iVar16 = 4;
        goto LAB_0012f25d;
      }
LAB_0012f10a:
      in_RDX = (char **)0x0;
      pbVar13 = pbVar18;
      do {
        pbVar13 = pbVar13 + 1;
        bVar21 = *pbVar13;
        if (bVar21 < 0x6c) {
          if (bVar21 == 0x62) {
            local_e70 = CONCAT71((int7)(local_e70 >> 8),1);
          }
          else if (bVar21 == 99) {
            local_e78 = 1;
          }
          else {
            if (bVar21 != 0x66) goto LAB_0012f17b;
            local_e88 = 1;
          }
        }
        else if (bVar21 == 0x6c) {
          bVar5 = true;
        }
        else if (bVar21 == 0x70) {
          local_e80 = 1;
        }
        else {
          if (bVar21 != 0x74) goto LAB_0012f17b;
          local_e90 = 1;
        }
        in_RDX = (char **)0x1;
      } while( true );
    }
    uVar23 = uVar15;
    iVar16 = 2;
    goto LAB_0012f25d;
  }
  local_e98 = (byte *)0x17c0d4;
  bVar26 = true;
  uVar23 = 0xffffffff;
  local_e88 = 0;
  local_ec0 = (byte *)0x17b004;
  local_e90 = 0;
  uVar15 = 0;
  local_e50 = 0;
  local_e58 = 0;
  local_e60 = 0;
  local_e68 = 0;
  local_ea0 = (byte *)0x0;
  local_ec4 = 0;
  local_e80 = 0;
  local_e78 = 0;
  bVar5 = false;
  iVar17 = 0;
LAB_0012fc14:
  if (!bVar26) {
    return iVar17;
  }
  if ((int)uVar23 < 0) {
    usage(*argv,"Please specify one or several input file",iVar7);
    return 2;
  }
  Hpipe::ErrorList::ErrorList(&local_ac0);
  local_e48.last = (Set *)0x0;
  local_e48.used = 0x20;
  Hpipe::Lexer::Lexer(&local_a30,&local_ac0,&local_e48);
  if (!bVar5) {
    args_2 = local_cc0;
    local_cc0[0]._M_dataplus._M_p = local_cc0[0]._M_dataplus._M_p & 0xffffffffffffff00;
    pSVar8 = Hpipe::Pool<Hpipe::Source,32>::New<char_const(&)[22],char(&)[6897],bool>
                       ((Pool<Hpipe::Source,32> *)&local_e48,(char (*) [22])"src/Hpipe/predef.sipe",
                        &predef,(bool *)args_2);
    Hpipe::Lexer::read(&local_a30,(int)pSVar8,__buf,(size_t)args_2);
  }
  if ((int)uVar23 < argc) {
    args = argv + uVar23;
    do {
      pSVar8 = Hpipe::Pool<Hpipe::Source,32>::New<char*&>((Pool<Hpipe::Source,32> *)&local_e48,args)
      ;
      Hpipe::Lexer::read(&local_a30,(int)pSVar8,__buf_00,(size_t)argv);
      args = args + 1;
      uVar22 = (int)uVar23 + 1;
      uVar23 = (ulong)uVar22;
    } while ((int)uVar22 < argc);
  }
  if (bVar5) {
    pLVar9 = Hpipe::Lexer::root(&local_a30);
    iVar7 = 0;
    Hpipe::Lexem::display_dot(pLVar9,".res.dot",(char *)0x0);
    goto LAB_00131303;
  }
  bVar5 = Hpipe::ErrorList::operator_cast_to_bool(&local_ac0);
  iVar7 = 1;
  if (!bVar5) goto LAB_00131303;
  Hpipe::Lexer::flags_abi_cxx11_
            ((Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_e18,&local_a30);
  local_eb8 = (long *)0x0;
  iStack_eb0._M_current = (char **)0x0;
  local_ea8 = (char **)0x0;
  local_cc0[0]._M_dataplus._M_p = "beg_flags section";
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_eb8,(iterator)0x0,
             (char **)local_cc0);
  if (local_e18.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_e18.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar25 = local_e18.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_cc0[0]._M_dataplus._M_p = (pbVar25->_M_dataplus)._M_p;
      if (iStack_eb0._M_current == local_ea8) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_eb8,iStack_eb0,
                   (char **)local_cc0);
      }
      else {
        *iStack_eb0._M_current = local_cc0[0]._M_dataplus._M_p;
        iStack_eb0._M_current = iStack_eb0._M_current + 1;
      }
      pbVar25 = pbVar25 + 1;
    } while (pbVar25 !=
             local_e18.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  sVar14 = (long)iStack_eb0._M_current - (long)local_eb8 >> 3;
  bVar5 = true;
  iVar7 = iVar17;
  if (1 < sVar14) {
    uVar23 = 1;
LAB_0012fe3f:
    uVar24 = (uint)uVar23;
    pbVar18 = (byte *)local_eb8[uVar23];
    uVar22 = uVar24;
    if (*pbVar18 == 0x2d) {
      bVar3 = pbVar18[1];
      if (bVar3 == 0x2d) {
        lVar12 = 0;
        do {
          lVar4 = lVar12 + 2;
          if ((pbVar18[lVar4] == 0) && ("disp_lexem_graph"[lVar12] == '\0')) goto LAB_001302ba;
          bVar21 = "disp_lexem_graph"[lVar12];
          if (bVar21 == 0x5f) {
            bVar21 = 0x2d;
          }
          lVar12 = lVar12 + 1;
        } while (pbVar18[lVar4] == bVar21);
        lVar12 = 0;
        do {
          lVar4 = lVar12 + 2;
          uVar11 = (undefined7)((ulong)local_eb8 >> 8);
          if ((pbVar18[lVar4] == 0) && ("disp_char_graph"[lVar12] == '\0')) {
            local_e78 = CONCAT71(uVar11,1);
            goto LAB_001302ba;
          }
          bVar21 = "disp_char_graph"[lVar12];
          if (bVar21 == 0x5f) {
            bVar21 = 0x2d;
          }
          lVar12 = lVar12 + 1;
        } while (pbVar18[lVar4] == bVar21);
        lVar12 = 0;
        do {
          lVar4 = lVar12 + 2;
          if ((pbVar18[lVar4] == 0) && ("disp_inst_graph"[lVar12] == '\0')) {
            if ((ulong)(long)(int)(uVar24 + 1) < sVar14) {
              sVar14 = (size_t)(uVar24 + 1);
              local_e98 = (byte *)local_eb8[sVar14];
              goto LAB_001302a6;
            }
            printf("%s","Error: ");
            putchar(0x69);
            printf("%s"," or --");
            _preparg_dispu("disp_inst_graph");
            puts(" must be followed by an argument.\n");
            printf("%s","Try \'");
            pcVar19 = (char *)*local_eb8;
            if (pcVar19 == (char *)0x0) {
              pcVar19 = "";
            }
            printf("%s",pcVar19);
            puts(" --help\' for more information.");
            iVar7 = 5;
            goto LAB_0013039a;
          }
          bVar21 = "disp_inst_graph"[lVar12];
          if (bVar21 == 0x5f) {
            bVar21 = 0x2d;
          }
          lVar12 = lVar12 + 1;
        } while (pbVar18[lVar4] == bVar21);
        lVar12 = 0;
LAB_0012fef0:
        lVar4 = lVar12 + 2;
        if ((pbVar18[lVar4] != 0) || ("disp_inst_pred"[lVar12] != '\0')) goto LAB_0012ff05;
        local_e80 = CONCAT71(uVar11,1);
LAB_001302ba:
        iVar17 = 0xf;
        goto LAB_001302bf;
      }
LAB_00130179:
      bVar5 = false;
      pbVar13 = pbVar18;
      do {
        pbVar13 = pbVar13 + 1;
        bVar21 = *pbVar13;
        if (bVar21 < 0x6c) {
          if (bVar21 == 0x62) {
            uVar15 = 1;
          }
          else if (bVar21 == 99) {
            local_e78 = 1;
          }
          else {
            if (bVar21 != 0x66) goto LAB_001301ee;
            local_e88 = 1;
          }
        }
        else if (bVar21 != 0x6c) {
          if (bVar21 == 0x70) {
            local_e80 = 1;
          }
          else {
            if (bVar21 != 0x74) goto LAB_001301ee;
            local_e90 = 1;
          }
        }
        bVar5 = true;
      } while( true );
    }
    iVar17 = 0xd;
    goto LAB_001302bf;
  }
LAB_00130b65:
  if (bVar5) {
    Hpipe::CharGraph::CharGraph(&local_338,&local_a30);
    paVar1 = &local_cc0[0].field_2;
    local_cc0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_cc0,"main","");
    pLVar9 = Hpipe::Lexer::find_machine(&local_a30,local_cc0);
    Hpipe::CharGraph::read(&local_338,(int)pLVar9,__buf_01,sVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_cc0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_cc0[0]._M_dataplus._M_p,
                      CONCAT71(local_cc0[0].field_2._M_allocated_capacity._1_7_,
                               local_cc0[0].field_2._M_local_buf[0]) + 1);
    }
    if ((local_e78 & 1) != 0) {
      Hpipe::CharGraph::display_dot(&local_338,".char.dot",(char *)0x0);
    }
    iVar7 = 1;
    if (local_338.ok == true) {
      Hpipe::InstructionGraph::InstructionGraph(&local_4f8);
      iVar7 = strcmp((char *)local_ec0,"C_STR");
      local_4f8.stop_char = -(uint)(iVar7 != 0) | local_ec4;
      local_4f8.boyer_moore = (bool)((byte)local_e50 & 1);
      local_4f8.no_training = (bool)((byte)local_e60 & 1);
      local_4f8.never_ending = (bool)((byte)local_e68 & 1);
      std::__cxx11::string::string((string *)local_cc0,(char *)local_e98,(allocator *)&local_900);
      std::__cxx11::istringstream::istringstream(local_1b0,(string *)local_cc0,_S_in);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cc0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_cc0[0]._M_dataplus._M_p,
                        CONCAT71(local_cc0[0].field_2._M_allocated_capacity._1_7_,
                                 local_cc0[0].field_2._M_local_buf[0]) + 1);
      }
      std::
      istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
      ::istream_iterator(&local_cf0,(istream_type *)local_1b0);
      paVar2 = &local_d20._M_value.field_2;
      local_d20._M_stream = (istream_type *)0x0;
      local_d20._M_value._M_string_length = 0;
      local_d20._M_value.field_2._M_local_buf[0] = '\0';
      local_d20._M_ok = false;
      local_d20._M_value._M_dataplus._M_p = (pointer)paVar2;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_dc0,
                 &local_cf0,&local_d20,(allocator_type *)local_cc0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d20._M_value._M_dataplus._M_p != paVar2) {
        operator_delete(local_d20._M_value._M_dataplus._M_p,
                        CONCAT71(local_d20._M_value.field_2._M_allocated_capacity._1_7_,
                                 local_d20._M_value.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cf0._M_value._M_dataplus._M_p != &local_cf0._M_value.field_2) {
        operator_delete(local_cf0._M_value._M_dataplus._M_p,
                        local_cf0._M_value.field_2._M_allocated_capacity + 1);
      }
      sVar14 = (size_t)((byte)local_e80 & 1);
      Hpipe::InstructionGraph::read(&local_4f8,(int)&local_338,&local_dc0,sVar14);
      Hpipe::CppEmitter::CppEmitter(&local_900);
      local_900.trace_labels = (bool)((byte)local_e58 & 1);
      iVar7 = strcmp((char *)local_ec0,"HPIPE_CB_STRING_PTR");
      if (iVar7 == 0) {
        local_900.buffer_type = 0;
        __buf_02 = extraout_RDX_13;
LAB_00130e79:
        Hpipe::CppEmitter::read(&local_900,(int)&local_4f8,__buf_02,sVar14);
        if ((uVar15 & 1) != 0) {
          Hpipe::Lexer::training_data((Vec<Hpipe::Lexer::TrainingData> *)local_cc0,&local_a30);
          Hpipe::CppEmitter::bench
                    (&local_900,
                     (vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                      *)local_cc0);
          std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>::
          ~vector((vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_> *
                  )local_cc0);
        }
        if ((local_e90 & 1) == 0) {
          iVar7 = 0;
          if ((uVar15 & 1) == 0) {
            local_cc0[0]._M_string_length = 0;
            local_cc0[0].field_2._M_local_buf[0] = '\0';
            local_de0._M_string_length = 0;
            local_de0.field_2._M_local_buf[0] = '\0';
            local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
            local_de0._M_dataplus._M_p = (pointer)&local_de0.field_2;
            local_cc0[0]._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e38,"\n","");
            local_e00._M_string_length = 0;
            local_e00.field_2._M_local_buf[0] = '\0';
            local_e00._M_dataplus._M_p = (pointer)&local_e00.field_2;
            Hpipe::StreamSepMaker::StreamSepMaker
                      (&local_da8,(TS *)&std::cout,local_cc0,&local_de0,&local_e38,&local_e00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e00._M_dataplus._M_p != &local_e00.field_2) {
              operator_delete(local_e00._M_dataplus._M_p,
                              CONCAT71(local_e00.field_2._M_allocated_capacity._1_7_,
                                       local_e00.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
              operator_delete(local_e38._M_dataplus._M_p,local_e38.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_de0._M_dataplus._M_p != &local_de0.field_2) {
              operator_delete(local_de0._M_dataplus._M_p,
                              CONCAT71(local_de0.field_2._M_allocated_capacity._1_7_,
                                       local_de0.field_2._M_local_buf[0]) + 1);
            }
            pbVar18 = local_ea0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_cc0[0]._M_dataplus._M_p != paVar1) {
              operator_delete(local_cc0[0]._M_dataplus._M_p,
                              CONCAT71(local_cc0[0].field_2._M_allocated_capacity._1_7_,
                                       local_cc0[0].field_2._M_local_buf[0]) + 1);
            }
            std::ofstream::ofstream(local_cc0);
            if (pbVar18 != (byte *)0x0) {
              std::ofstream::open((char *)local_cc0,(_Ios_Openmode)pbVar18);
              local_da8.stream = (TS *)local_cc0;
            }
            Hpipe::StreamSepMaker::operator<<
                      (&local_540,&local_da8,
                       (char (*) [104])
                       "// ----------------------------------------------------------------------------------------------------"
                      );
            Hpipe::StreamSep::~StreamSep(&local_540);
            Hpipe::StreamSepMaker::operator<<
                      (&local_588,&local_da8,(char (*) [27])"#ifdef HPIPE_PRELIMINARIES");
            Hpipe::StreamSep::~StreamSep(&local_588);
            Hpipe::CppEmitter::write_preliminaries(&local_900,&local_da8);
            Hpipe::StreamSepMaker::operator<<
                      (&local_5d0,&local_da8,(char (*) [30])"#endif // HPIPE_PRELIMINARIES");
            Hpipe::StreamSep::~StreamSep(&local_5d0);
            Hpipe::StreamSepMaker::operator<<(&local_618,&local_da8,(char (*) [1])0x17c0d4);
            Hpipe::StreamSep::~StreamSep(&local_618);
            Hpipe::StreamSepMaker::operator<<
                      (&local_660,&local_da8,
                       (char (*) [104])
                       "// ----------------------------------------------------------------------------------------------------"
                      );
            Hpipe::StreamSep::~StreamSep(&local_660);
            Hpipe::StreamSepMaker::operator<<
                      (&local_6a8,&local_da8,(char (*) [26])"#ifdef HPIPE_DECLARATIONS");
            Hpipe::StreamSep::~StreamSep(&local_6a8);
            Hpipe::CppEmitter::write_declarations(&local_900,&local_da8);
            Hpipe::StreamSepMaker::operator<<
                      (&local_6f0,&local_da8,(char (*) [29])"#endif // HPIPE_DECLARATIONS");
            Hpipe::StreamSep::~StreamSep(&local_6f0);
            Hpipe::StreamSepMaker::operator<<(&local_738,&local_da8,(char (*) [1])0x17c0d4);
            Hpipe::StreamSep::~StreamSep(&local_738);
            Hpipe::StreamSepMaker::operator<<
                      (&local_780,&local_da8,
                       (char (*) [104])
                       "// ----------------------------------------------------------------------------------------------------"
                      );
            Hpipe::StreamSep::~StreamSep(&local_780);
            Hpipe::StreamSepMaker::operator<<
                      (&local_7c8,&local_da8,(char (*) [25])"#ifdef HPIPE_DEFINITIONS");
            Hpipe::StreamSep::~StreamSep(&local_7c8);
            Hpipe::CppEmitter::write_definitions(&local_900,&local_da8);
            Hpipe::StreamSepMaker::operator<<
                      (&local_810,&local_da8,(char (*) [28])"#endif // HPIPE_DEFINITIONS");
            Hpipe::StreamSep::~StreamSep(&local_810);
            std::ofstream::~ofstream(local_cc0);
            Hpipe::StreamSepMaker::~StreamSepMaker(&local_da8);
            iVar7 = 0;
          }
        }
        else {
          Hpipe::Lexer::test_data((Vec<Hpipe::Lexer::TestData> *)local_cc0,&local_a30);
          iVar7 = Hpipe::CppEmitter::test
                            (&local_900,
                             (vector<Hpipe::Lexer::TestData,_std::allocator<Hpipe::Lexer::TestData>_>
                              *)local_cc0);
          std::vector<Hpipe::Lexer::TestData,_std::allocator<Hpipe::Lexer::TestData>_>::~vector
                    ((vector<Hpipe::Lexer::TestData,_std::allocator<Hpipe::Lexer::TestData>_> *)
                     local_cc0);
        }
      }
      else {
        iVar7 = strcmp((char *)local_ec0,"HPIPE_BUFFER");
        if (iVar7 == 0) {
          local_900.buffer_type = 1;
          __buf_02 = extraout_RDX_14;
          goto LAB_00130e79;
        }
        iVar7 = strcmp((char *)local_ec0,"BEG_END");
        if (iVar7 == 0) {
          local_900.buffer_type = 2;
          __buf_02 = extraout_RDX_15;
          goto LAB_00130e79;
        }
        iVar7 = strcmp((char *)local_ec0,"C_STR");
        if (iVar7 == 0) {
          local_900.buffer_type = 3;
          __buf_02 = extraout_RDX_16;
          goto LAB_00130e79;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parse style ( ",0x16);
        poVar10 = std::operator<<((ostream *)&std::cerr,(char *)local_ec0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10," ). Possible values are HPIPE_BUFFER, BEG_END or C_STR",0x36);
        iVar7 = 1;
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      Hpipe::CppEmitter::~CppEmitter(&local_900);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_dc0);
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
      Hpipe::InstructionGraph::~InstructionGraph(&local_4f8);
    }
    Hpipe::CharGraph::~CharGraph(&local_338);
  }
  if (local_eb8 != (long *)0x0) {
    operator_delete(local_eb8,(long)local_ea8 - (long)local_eb8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e18);
LAB_00131303:
  Hpipe::Pool<Hpipe::Lexem,_32>::~Pool(&local_a30.lexem_pool);
  if (local_a30.stack_last.super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a30.stack_last.
                    super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a30.stack_last.
                          super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a30.stack_last.
                          super__Vector_base<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a30.first_item.str._M_dataplus._M_p != &local_a30.first_item.str.field_2) {
    operator_delete(local_a30.first_item.str._M_dataplus._M_p,
                    local_a30.first_item.str.field_2._M_allocated_capacity + 1);
  }
  Hpipe::Pool<Hpipe::Source,_32>::~Pool(&local_e48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0.out.end._M_dataplus._M_p != &local_ac0.out.end.field_2) {
    operator_delete(local_ac0.out.end._M_dataplus._M_p,
                    local_ac0.out.end.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0.out.sep._M_dataplus._M_p != &local_ac0.out.sep.field_2) {
    operator_delete(local_ac0.out.sep._M_dataplus._M_p,
                    local_ac0.out.sep.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0.out.beg._M_dataplus._M_p != &local_ac0.out.beg.field_2) {
    operator_delete(local_ac0.out.beg._M_dataplus._M_p,
                    local_ac0.out.beg.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0.out.first_beg._M_dataplus._M_p != &local_ac0.out.first_beg.field_2) {
    operator_delete(local_ac0.out.first_beg._M_dataplus._M_p,
                    local_ac0.out.first_beg.field_2._M_allocated_capacity + 1);
  }
  return iVar7;
LAB_0012ee79:
  bVar20 = "disp_inst_pred"[lVar12];
  if (bVar20 == 0x5f) {
    bVar20 = 0x2d;
  }
  lVar12 = lVar12 + 1;
  if (bVar21 != bVar20) goto code_r0x0012ee8e;
  goto LAB_0012ee66;
code_r0x0012ee8e:
  lVar12 = 0;
  do {
    bVar21 = pbVar18[lVar12 + 2];
    in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
    if ((bVar21 == 0) && ("disp_trans_freq"[lVar12] == '\0')) {
      local_e88 = 1;
      iVar16 = 4;
      goto LAB_0012f25d;
    }
    bVar20 = "disp_trans_freq"[lVar12];
    if (bVar20 == 0x5f) {
      bVar20 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (bVar21 == bVar20);
  lVar12 = 0;
  do {
    bVar21 = pbVar18[lVar12 + 2];
    in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
    if ((bVar21 == 0) && ("\nend_test"[lVar12 + 5] == '\0')) {
      local_e90 = 1;
      iVar16 = 4;
      goto LAB_0012f25d;
    }
    bVar20 = "\nend_test"[lVar12 + 5];
    if (bVar20 == 0x5f) {
      bVar20 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (bVar21 == bVar20);
  lVar12 = 0;
  do {
    bVar21 = pbVar18[lVar12 + 2];
    in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
    if ((bVar21 == 0) && ("benchmark"[lVar12] == '\0')) {
      local_e70 = 1;
      iVar16 = 4;
      goto LAB_0012f25d;
    }
    bVar20 = "benchmark"[lVar12];
    if (bVar20 == 0x5f) {
      bVar20 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (bVar21 == bVar20);
  lVar12 = 0;
  do {
    bVar21 = pbVar18[lVar12 + 2];
    in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
    if ((bVar21 == 0) && ("boyer_moore"[lVar12] == '\0')) {
      local_e50 = 1;
      iVar16 = 4;
      goto LAB_0012f25d;
    }
    bVar20 = "boyer_moore"[lVar12];
    if (bVar20 == 0x5f) {
      bVar20 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (bVar21 == bVar20);
  lVar12 = 0;
  do {
    bVar21 = pbVar18[lVar12 + 2];
    in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
    if ((bVar21 == 0) && ("trace_labels"[lVar12] == '\0')) {
      local_e58 = 1;
      iVar16 = 4;
      goto LAB_0012f25d;
    }
    bVar20 = "trace_labels"[lVar12];
    if (bVar20 == 0x5f) {
      bVar20 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (bVar21 == bVar20);
  lVar12 = 0;
  do {
    bVar21 = pbVar18[lVar12 + 2];
    in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
    if ((bVar21 == 0) && ("no_training"[lVar12] == '\0')) {
      local_e60 = 1;
      iVar16 = 4;
      goto LAB_0012f25d;
    }
    bVar20 = "no_training"[lVar12];
    if (bVar20 == 0x5f) {
      bVar20 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (bVar21 == bVar20);
  lVar12 = 0;
  do {
    bVar21 = pbVar18[lVar12 + 2];
    in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
    if ((bVar21 == 0) && ("never_ending"[lVar12] == '\0')) {
      local_e68 = 1;
      iVar16 = 4;
      goto LAB_0012f25d;
    }
    bVar20 = "never_ending"[lVar12];
    if (bVar20 == 0x5f) {
      bVar20 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (bVar21 == bVar20);
  lVar12 = 0;
  do {
    bVar21 = pbVar18[lVar12 + 2];
    in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
    if ((bVar21 == 0) && ("output"[lVar12] == '\0')) {
      if (iVar7 + 1 < argc) {
        local_ea0 = (byte *)argv[iVar7 + 1];
        in_RDX = argv;
        goto LAB_0012f24d;
      }
      printf("%s","Error: ");
      putchar(0x6f);
      printf("%s"," or --");
      _preparg_dispu("output");
      puts(" must be followed by an argument.\n");
      printf("%s","Try \'");
      pcVar19 = *argv;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = "";
      }
      printf("%s",pcVar19);
      puts(" --help\' for more information.");
      iVar17 = 0xe;
      in_RDX = extraout_RDX_08;
      goto LAB_0012f338;
    }
    bVar20 = "output"[lVar12];
    if (bVar20 == 0x5f) {
      bVar20 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (bVar21 == bVar20);
  lVar12 = 0;
  do {
    bVar21 = pbVar18[lVar12 + 2];
    in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
    if ((bVar21 == 0) && ("style"[lVar12] == '\0')) {
      if (iVar7 + 1 < argc) {
        local_ec0 = (byte *)argv[iVar7 + 1];
        in_RDX = argv;
        goto LAB_0012f24d;
      }
      printf("%s","Error: ");
      putchar(0x73);
      printf("%s"," or --");
      _preparg_dispu("style");
      puts(" must be followed by an argument.\n");
      printf("%s","Try \'");
      pcVar19 = *argv;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = "";
      }
      printf("%s",pcVar19);
      puts(" --help\' for more information.");
      iVar17 = 0xf;
      in_RDX = extraout_RDX_10;
      goto LAB_0012f338;
    }
    bVar20 = "style"[lVar12];
    if (bVar20 == 0x5f) {
      bVar20 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (bVar21 == bVar20);
  lVar12 = 0;
  do {
    bVar21 = pbVar18[lVar12 + 2];
    in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
    if ((bVar21 == 0) && ("stop_char"[lVar12] == '\0')) {
      iVar6 = iVar7 + 1;
      if ((iVar6 < argc) &&
         (bVar26 = _preparg_atoi((int *)local_cc0,argv[iVar6]), iVar7 = iVar6, bVar26)) {
        local_ec4 = (uint)local_cc0[0]._M_dataplus._M_p;
        in_RDX = extraout_RDX_07;
        iVar16 = 4;
      }
      else {
        iVar6 = iVar7;
        printf("%s","Error: ");
        putchar(0);
        printf("%s"," or --");
        _preparg_dispu("stop_char");
        puts(" must be followed by an integer.\n");
        printf("%s","Try \'");
        pcVar19 = *argv;
        if (pcVar19 == (char *)0x0) {
          pcVar19 = "";
        }
        printf("%s",pcVar19);
        puts(" --help\' for more information.");
        iVar17 = 0x10;
        in_RDX = extraout_RDX_12;
        iVar16 = 1;
      }
      goto LAB_0012f25d;
    }
    bVar20 = "stop_char"[lVar12];
    if (bVar20 == 0x5f) {
      bVar20 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (bVar21 == bVar20);
  lVar12 = 0;
  do {
    bVar21 = pbVar18[lVar12 + 2];
    in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
    if ((bVar21 == 0) && ("args"[lVar12] == '\0')) {
      if (iVar7 + 1 < argc) goto LAB_0012f24d;
      printf("%s","Error: ");
      putchar(0x61);
      printf("%s"," or --");
      _preparg_dispu("args");
      puts(" must be followed by an argument.\n");
      printf("%s","Try \'");
      pcVar19 = *argv;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = "";
      }
      printf("%s",pcVar19);
      puts(" --help\' for more information.");
      iVar17 = 0x11;
      in_RDX = extraout_RDX_09;
      goto LAB_0012f338;
    }
    bVar20 = "args"[lVar12];
    if (bVar20 == 0x5f) {
      bVar20 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (bVar21 == bVar20);
  lVar12 = 0;
LAB_0012f0d6:
  bVar21 = pbVar18[lVar12 + 2];
  in_RDX = (char **)CONCAT71((int7)((ulong)in_RDX >> 8),bVar21);
  if ((bVar21 != 0) || ("help"[lVar12] != '\0')) goto LAB_0012f0ef;
  iVar17 = 0;
  usage(*argv,(char *)0x0,(int)in_RDX);
  in_RDX = extraout_RDX_11;
LAB_0012f338:
  iVar16 = 1;
  goto LAB_0012f25d;
LAB_0012f24d:
  iVar16 = 4;
  iVar6 = iVar7 + 1;
  goto LAB_0012f25d;
LAB_0012f0ef:
  bVar20 = "help"[lVar12];
  if (bVar20 == 0x5f) {
    bVar20 = 0x2d;
  }
  lVar12 = lVar12 + 1;
  if (bVar21 != bVar20) goto LAB_0012f10a;
  goto LAB_0012f0d6;
LAB_0012f17b:
  iVar16 = 4;
  if (in_RDX == (char **)0x0) {
    if (bVar3 < 0x69) {
      if (bVar3 == 0) {
        if (pbVar18[2] == 0) {
          uVar22 = iVar7 + 1;
          uVar15 = (ulong)uVar22;
          if ((int)uVar22 < argc) {
            pbVar18 = (byte *)argv[(int)uVar22];
            goto LAB_0012f493;
          }
        }
        else {
          pbVar18 = pbVar18 + 2;
LAB_0012f493:
          bVar26 = _preparg_atoi((int *)local_cc0,(char *)pbVar18);
          if (bVar26) {
            local_ec4 = (uint)local_cc0[0]._M_dataplus._M_p;
            in_RDX = extraout_RDX_02;
            goto LAB_0012f18a;
          }
        }
        printf("%s","Error: ");
        putchar(0);
        printf("%s"," or --");
        _preparg_dispu("stop_char");
        puts(" must be followed by an integer.\n");
        printf("%s","Try \'");
        pcVar19 = *argv;
        if (pcVar19 == (char *)0x0) {
          pcVar19 = "";
        }
        printf("%s",pcVar19);
        puts(" --help\' for more information.");
        iVar17 = 0x10;
        iVar16 = 1;
        in_RDX = extraout_RDX_03;
      }
      else if (bVar3 == 0x61) {
        if ((pbVar18[2] == 0) && (uVar15 = (ulong)(iVar7 + 1U), argc <= (int)(iVar7 + 1U))) {
          printf("%s","Error: ");
          putchar(0x61);
          printf("%s"," or --");
          _preparg_dispu("args");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar19 = *argv;
          if (pcVar19 == (char *)0x0) {
            pcVar19 = "";
          }
          printf("%s",pcVar19);
          puts(" --help\' for more information.");
          iVar17 = 0x11;
          in_RDX = extraout_RDX_01;
          goto LAB_0012f7e5;
        }
      }
      else if (bVar3 == 0x68) {
        iVar17 = 0;
        usage(*argv,(char *)0x0,0);
        in_RDX = extraout_RDX;
LAB_0012f7e5:
        iVar16 = 1;
      }
      else {
LAB_0012f36d:
        iVar16 = 0;
      }
    }
    else if (bVar3 == 0x73) {
      if (pbVar18[2] == 0) {
        uVar22 = iVar7 + 1;
        uVar15 = (ulong)uVar22;
        if (argc <= (int)uVar22) {
          printf("%s","Error: ");
          putchar(0x73);
          printf("%s"," or --");
          _preparg_dispu("style");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar19 = *argv;
          if (pcVar19 == (char *)0x0) {
            pcVar19 = "";
          }
          printf("%s",pcVar19);
          puts(" --help\' for more information.");
          iVar17 = 0xf;
          in_RDX = extraout_RDX_04;
          goto LAB_0012f7e5;
        }
        local_ec0 = (byte *)argv[(int)uVar22];
      }
      else {
        local_ec0 = pbVar18 + 2;
      }
    }
    else if (bVar3 == 0x6f) {
      if (pbVar18[2] == 0) {
        uVar22 = iVar7 + 1;
        uVar15 = (ulong)uVar22;
        if (argc <= (int)uVar22) {
          printf("%s","Error: ");
          putchar(0x6f);
          printf("%s"," or --");
          _preparg_dispu("output");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar19 = *argv;
          if (pcVar19 == (char *)0x0) {
            pcVar19 = "";
          }
          printf("%s",pcVar19);
          puts(" --help\' for more information.");
          iVar17 = 0xe;
          in_RDX = extraout_RDX_06;
          goto LAB_0012f7e5;
        }
        local_ea0 = (byte *)argv[(int)uVar22];
      }
      else {
        local_ea0 = pbVar18 + 2;
      }
    }
    else {
      if (bVar3 != 0x69) goto LAB_0012f36d;
      if (pbVar18[2] == 0) {
        uVar22 = iVar7 + 1;
        uVar15 = (ulong)uVar22;
        if (argc <= (int)uVar22) {
          printf("%s","Error: ");
          putchar(0x69);
          printf("%s"," or --");
          _preparg_dispu("disp_inst_graph");
          puts(" must be followed by an argument.\n");
          printf("%s","Try \'");
          pcVar19 = *argv;
          if (pcVar19 == (char *)0x0) {
            pcVar19 = "";
          }
          printf("%s",pcVar19);
          puts(" --help\' for more information.");
          iVar17 = 5;
          in_RDX = extraout_RDX_05;
          goto LAB_0012f7e5;
        }
        local_e98 = (byte *)argv[(int)uVar22];
      }
      else {
        local_e98 = pbVar18 + 2;
      }
    }
  }
LAB_0012f18a:
  iVar6 = (int)uVar15;
  if (iVar16 == 0) {
    uVar23 = uVar15;
  }
  if (iVar16 == 0) {
    iVar16 = 2;
  }
LAB_0012f25d:
  iVar7 = (int)in_RDX;
  if (iVar16 != 4) goto LAB_0012fc09;
  uVar15 = (ulong)(iVar6 + 1U);
  if (argc <= (int)(iVar6 + 1U)) goto LAB_0012fc04;
  goto LAB_0012edbf;
LAB_0012fc04:
  iVar16 = 2;
LAB_0012fc09:
  bVar26 = iVar16 == 2;
  uVar15 = local_e70;
  goto LAB_0012fc14;
LAB_0012ff05:
  bVar21 = "disp_inst_pred"[lVar12];
  if (bVar21 == 0x5f) {
    bVar21 = 0x2d;
  }
  lVar12 = lVar12 + 1;
  if (pbVar18[lVar4] != bVar21) goto code_r0x0012ff1a;
  goto LAB_0012fef0;
code_r0x0012ff1a:
  lVar12 = 0;
  do {
    lVar4 = lVar12 + 2;
    if ((pbVar18[lVar4] == 0) && ("disp_trans_freq"[lVar12] == '\0')) {
      local_e88 = CONCAT71(uVar11,1);
      iVar17 = 0xf;
      goto LAB_001302bf;
    }
    bVar21 = "disp_trans_freq"[lVar12];
    if (bVar21 == 0x5f) {
      bVar21 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (pbVar18[lVar4] == bVar21);
  lVar12 = 0;
  do {
    lVar4 = lVar12 + 2;
    if ((pbVar18[lVar4] == 0) && ("\nend_test"[lVar12 + 5] == '\0')) {
      local_e90 = CONCAT71(uVar11,1);
      iVar17 = 0xf;
      goto LAB_001302bf;
    }
    bVar21 = "\nend_test"[lVar12 + 5];
    if (bVar21 == 0x5f) {
      bVar21 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (pbVar18[lVar4] == bVar21);
  lVar12 = 0;
  do {
    lVar4 = lVar12 + 2;
    if ((pbVar18[lVar4] == 0) && ("benchmark"[lVar12] == '\0')) {
      uVar15 = 1;
      iVar17 = 0xf;
      goto LAB_001302bf;
    }
    bVar21 = "benchmark"[lVar12];
    if (bVar21 == 0x5f) {
      bVar21 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (pbVar18[lVar4] == bVar21);
  lVar12 = 0;
  do {
    lVar4 = lVar12 + 2;
    if ((pbVar18[lVar4] == 0) && ("boyer_moore"[lVar12] == '\0')) {
      local_e50 = CONCAT71(uVar11,1);
      iVar17 = 0xf;
      goto LAB_001302bf;
    }
    bVar21 = "boyer_moore"[lVar12];
    if (bVar21 == 0x5f) {
      bVar21 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (pbVar18[lVar4] == bVar21);
  lVar12 = 0;
  do {
    lVar4 = lVar12 + 2;
    if ((pbVar18[lVar4] == 0) && ("trace_labels"[lVar12] == '\0')) {
      local_e58 = CONCAT71(uVar11,1);
      iVar17 = 0xf;
      goto LAB_001302bf;
    }
    bVar21 = "trace_labels"[lVar12];
    if (bVar21 == 0x5f) {
      bVar21 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (pbVar18[lVar4] == bVar21);
  lVar12 = 0;
  do {
    lVar4 = lVar12 + 2;
    if ((pbVar18[lVar4] == 0) && ("no_training"[lVar12] == '\0')) {
      local_e60 = CONCAT71(uVar11,1);
      iVar17 = 0xf;
      goto LAB_001302bf;
    }
    bVar21 = "no_training"[lVar12];
    if (bVar21 == 0x5f) {
      bVar21 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (pbVar18[lVar4] == bVar21);
  lVar12 = 0;
  do {
    lVar4 = lVar12 + 2;
    if ((pbVar18[lVar4] == 0) && ("never_ending"[lVar12] == '\0')) {
      local_e68 = CONCAT71(uVar11,1);
      iVar17 = 0xf;
      goto LAB_001302bf;
    }
    bVar21 = "never_ending"[lVar12];
    if (bVar21 == 0x5f) {
      bVar21 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (pbVar18[lVar4] == bVar21);
  lVar12 = 0;
  do {
    lVar4 = lVar12 + 2;
    if ((pbVar18[lVar4] == 0) && ("output"[lVar12] == '\0')) {
      if ((ulong)(long)(int)(uVar24 + 1) < sVar14) {
        sVar14 = (size_t)(uVar24 + 1);
        local_ea0 = (byte *)local_eb8[sVar14];
        goto LAB_001302a6;
      }
      printf("%s","Error: ");
      putchar(0x6f);
      printf("%s"," or --");
      _preparg_dispu("output");
      puts(" must be followed by an argument.\n");
      printf("%s","Try \'");
      pcVar19 = (char *)*local_eb8;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = "";
      }
      printf("%s",pcVar19);
      puts(" --help\' for more information.");
      iVar7 = 0xe;
      goto LAB_0013039a;
    }
    bVar21 = "output"[lVar12];
    if (bVar21 == 0x5f) {
      bVar21 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (pbVar18[lVar4] == bVar21);
  lVar12 = 0;
LAB_001300b0:
  lVar4 = lVar12 + 2;
  if ((pbVar18[lVar4] != 0) || ("style"[lVar12] != '\0')) goto LAB_001300c4;
  if ((ulong)(long)(int)(uVar24 + 1) < sVar14) {
    sVar14 = (size_t)(uVar24 + 1);
    local_ec0 = (byte *)local_eb8[sVar14];
LAB_001302a6:
    uVar22 = uVar24 + 1;
    iVar17 = 0xf;
    goto LAB_001302bf;
  }
  printf("%s","Error: ");
  putchar(0x73);
  printf("%s"," or --");
  _preparg_dispu("style");
  puts(" must be followed by an argument.\n");
  printf("%s","Try \'");
  pcVar19 = (char *)*local_eb8;
  if (pcVar19 == (char *)0x0) {
    pcVar19 = "";
  }
  printf("%s",pcVar19);
  puts(" --help\' for more information.");
  iVar7 = 0xf;
  goto LAB_0013039a;
LAB_001300c4:
  bVar21 = "style"[lVar12];
  if (bVar21 == 0x5f) {
    bVar21 = 0x2d;
  }
  lVar12 = lVar12 + 1;
  if (pbVar18[lVar4] != bVar21) goto code_r0x001300d9;
  goto LAB_001300b0;
code_r0x001300d9:
  lVar12 = 0;
  do {
    lVar4 = lVar12 + 2;
    if ((pbVar18[lVar4] == 0) && ("stop_char"[lVar12] == '\0')) {
      uVar22 = uVar24 + 1;
      if ((ulong)(long)(int)uVar22 < sVar14) {
        sVar14 = (size_t)uVar22;
        bVar5 = _preparg_atoi((int *)local_cc0,(char *)local_eb8[sVar14]);
        uVar24 = uVar22;
        if (bVar5) {
          local_ec4 = (uint)local_cc0[0]._M_dataplus._M_p;
          iVar17 = 0xf;
          goto LAB_001302bf;
        }
      }
      uVar22 = uVar24;
      printf("%s","Error: ");
      putchar(0);
      printf("%s"," or --");
      _preparg_dispu("stop_char");
      puts(" must be followed by an integer.\n");
      printf("%s","Try \'");
      pcVar19 = (char *)*local_eb8;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = "";
      }
      printf("%s",pcVar19);
      puts(" --help\' for more information.");
      iVar7 = 0x10;
      iVar17 = 1;
      goto LAB_001302bf;
    }
    bVar21 = "stop_char"[lVar12];
    if (bVar21 == 0x5f) {
      bVar21 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (pbVar18[lVar4] == bVar21);
  lVar12 = 0;
  do {
    lVar4 = lVar12 + 2;
    if ((pbVar18[lVar4] == 0) && ("args"[lVar12] == '\0')) {
      uVar22 = uVar24 + 1;
      iVar17 = 0xf;
      if ((ulong)(long)(int)uVar22 < sVar14) goto LAB_001302bf;
      printf("%s","Error: ");
      putchar(0x61);
      printf("%s"," or --");
      _preparg_dispu("args");
      puts(" must be followed by an argument.\n");
      printf("%s","Try \'");
      pcVar19 = (char *)*local_eb8;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = "";
      }
      printf("%s",pcVar19);
      puts(" --help\' for more information.");
      iVar7 = 0x11;
      goto LAB_0013039a;
    }
    bVar21 = "args"[lVar12];
    if (bVar21 == 0x5f) {
      bVar21 = 0x2d;
    }
    lVar12 = lVar12 + 1;
  } while (pbVar18[lVar4] == bVar21);
  lVar12 = 0;
LAB_00130141:
  lVar4 = lVar12 + 2;
  if ((pbVar18[lVar4] != 0) || ("help"[lVar12] != '\0')) goto LAB_0013015d;
  iVar7 = 0;
  usage((char *)*local_eb8,(char *)0x0,0x2d);
LAB_0013039a:
  uVar22 = uVar24;
  iVar17 = 1;
  goto LAB_001302bf;
LAB_0013015d:
  bVar21 = "help"[lVar12];
  if (bVar21 == 0x5f) {
    bVar21 = 0x2d;
  }
  lVar12 = lVar12 + 1;
  if (pbVar18[lVar4] != bVar21) goto LAB_00130179;
  goto LAB_00130141;
LAB_001301ee:
  iVar17 = 0xf;
  if (bVar5) goto LAB_001301fc;
  if (bVar3 < 0x69) {
    if (bVar3 == 0) {
      if (pbVar18[2] == 0) {
        uVar22 = uVar24 + 1;
        if ((ulong)(long)(int)uVar22 < sVar14) {
          sVar14 = (size_t)uVar22;
          pbVar18 = (byte *)local_eb8[sVar14];
          goto LAB_001304e9;
        }
      }
      else {
        pbVar18 = pbVar18 + 2;
LAB_001304e9:
        bVar5 = _preparg_atoi((int *)local_cc0,(char *)pbVar18);
        if (bVar5) {
          local_ec4 = (uint)local_cc0[0]._M_dataplus._M_p;
          goto LAB_001301fc;
        }
      }
      printf("%s","Error: ");
      putchar(0);
      printf("%s"," or --");
      _preparg_dispu("stop_char");
      puts(" must be followed by an integer.\n");
      printf("%s","Try \'");
      pcVar19 = (char *)*local_eb8;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = "";
      }
      printf("%s",pcVar19);
      puts(" --help\' for more information.");
      iVar7 = 0x10;
      iVar17 = 1;
      goto LAB_001301fc;
    }
    if (bVar3 == 0x61) {
      if ((pbVar18[2] != 0) || (uVar22 = uVar24 + 1, (ulong)(long)(int)(uVar24 + 1) < sVar14))
      goto LAB_001301fc;
      printf("%s","Error: ");
      putchar(0x61);
      printf("%s"," or --");
      _preparg_dispu("args");
      puts(" must be followed by an argument.\n");
      printf("%s","Try \'");
      pcVar19 = (char *)*local_eb8;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = "";
      }
      printf("%s",pcVar19);
      puts(" --help\' for more information.");
      iVar7 = 0x11;
      goto LAB_001307fa;
    }
    if (bVar3 != 0x68) {
LAB_001303cf:
      iVar17 = 0;
      goto LAB_001301fc;
    }
    iVar7 = 0;
    usage((char *)*local_eb8,(char *)0x0,0x68);
  }
  else {
    if (bVar3 == 0x73) {
      if (pbVar18[2] != 0) {
        local_ec0 = pbVar18 + 2;
        goto LAB_001301fc;
      }
      uVar22 = uVar24 + 1;
      if ((ulong)(long)(int)uVar22 < sVar14) {
        sVar14 = (size_t)uVar22;
        local_ec0 = (byte *)local_eb8[sVar14];
        goto LAB_001301fc;
      }
      printf("%s","Error: ");
      putchar(0x73);
      printf("%s"," or --");
      _preparg_dispu("style");
      puts(" must be followed by an argument.\n");
      printf("%s","Try \'");
      pcVar19 = (char *)*local_eb8;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = "";
      }
      printf("%s",pcVar19);
      puts(" --help\' for more information.");
      iVar7 = 0xf;
    }
    else if (bVar3 == 0x6f) {
      if (pbVar18[2] != 0) {
        local_ea0 = pbVar18 + 2;
        goto LAB_001301fc;
      }
      uVar22 = uVar24 + 1;
      if ((ulong)(long)(int)uVar22 < sVar14) {
        sVar14 = (size_t)uVar22;
        local_ea0 = (byte *)local_eb8[sVar14];
        goto LAB_001301fc;
      }
      printf("%s","Error: ");
      putchar(0x6f);
      printf("%s"," or --");
      _preparg_dispu("output");
      puts(" must be followed by an argument.\n");
      printf("%s","Try \'");
      pcVar19 = (char *)*local_eb8;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = "";
      }
      printf("%s",pcVar19);
      puts(" --help\' for more information.");
      iVar7 = 0xe;
    }
    else {
      if (bVar3 != 0x69) goto LAB_001303cf;
      if (pbVar18[2] != 0) {
        local_e98 = pbVar18 + 2;
        goto LAB_001301fc;
      }
      uVar22 = uVar24 + 1;
      if ((ulong)(long)(int)uVar22 < sVar14) {
        sVar14 = (size_t)uVar22;
        local_e98 = (byte *)local_eb8[sVar14];
        goto LAB_001301fc;
      }
      printf("%s","Error: ");
      putchar(0x69);
      printf("%s"," or --");
      _preparg_dispu("disp_inst_graph");
      puts(" must be followed by an argument.\n");
      printf("%s","Try \'");
      pcVar19 = (char *)*local_eb8;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = "";
      }
      printf("%s",pcVar19);
      puts(" --help\' for more information.");
      iVar7 = 5;
    }
LAB_001307fa:
    uVar24 = uVar24 + 1;
  }
  iVar17 = 1;
  uVar22 = uVar24;
LAB_001301fc:
  if (iVar17 == 0) {
    iVar17 = 0xd;
  }
LAB_001302bf:
  if (iVar17 != 0xf) goto LAB_00130b5c;
  uVar23 = (ulong)(uVar22 + 1);
  sVar14 = (long)iStack_eb0._M_current - (long)local_eb8 >> 3;
  if (sVar14 <= (ulong)(long)(int)(uVar22 + 1)) goto LAB_00130b57;
  goto LAB_0012fe3f;
LAB_00130b57:
  iVar17 = 0xd;
LAB_00130b5c:
  bVar5 = iVar17 == 0xd;
  goto LAB_00130b65;
}

Assistant:

int main( int argc, char **argv ) {
    // args
    #include <PrepArg/declarations.h>
    #include <PrepArg/parse.h>
    if ( beg_files < 0 )
        return usage( argv[ 0 ], "Please specify one or several input file", 2 );

    try {
        // lexems
        ErrorList error_list;
        Pool<Source> source_pool;
        Lexer lexer( error_list, source_pool );
        if ( not disp_lexem_graph )
            lexer.read( source_pool.New( "src/Hpipe/predef.sipe", predef, false ) );
        for( int i = beg_files; i < argc; ++i )
            lexer.read( source_pool.New( argv[ i ] ) );
        if ( disp_lexem_graph ) {
            lexer.root()->display_dot();
            return 0;
        }
        if ( ! error_list )
            return 1;

        // update flags
        Vec<std::string> lfs = lexer.flags();
        Vec<const char *> lfc;
        lfc << "beg_flags section";
        for( std::string &str : lfs )
            lfc << str.c_str();
        #undef PREPARG_ARGV
        #undef PREPARG_ARGC
        #define PREPARG_ARGC lfc.size()
        #define PREPARG_ARGV lfc
        #include <PrepArg/parse.h>

        // char and transitions
        CharGraph cg( lexer );
        cg.read( lexer.find_machine( "main" ) );
        if ( disp_char_graph )
            cg.display_dot();
        if ( ! cg.ok )
            return 1;

        // instruction graph
        InstructionGraph ig;
        ig.stop_char    = strcmp( style, "C_STR" ) == 0 ? stop_char : -1;
        ig.boyer_moore  = boyer_moore;
        ig.no_training  = no_training;
        ig.never_ending = never_ending;

        std::istringstream iss( disp_inst_graph );
        std::vector<std::string> disp( std::istream_iterator<std::string>{ iss }, std::istream_iterator<std::string>{} );
        ig.read( &cg, disp, disp_inst_pred, disp_trans_freq );

        // emitter
        CppEmitter ce;
        ce.trace_labels = trace_labels;

        if      ( strcmp( style, "HPIPE_CB_STRING_PTR" ) == 0 ) { ce.buffer_type = CppEmitter::BT_HPIPE_CB_STRING_PTR; }
        else if ( strcmp( style, "HPIPE_BUFFER"        ) == 0 ) { ce.buffer_type = CppEmitter::BT_HPIPE_BUFFER       ; }
        else if ( strcmp( style, "BEG_END"             ) == 0 ) { ce.buffer_type = CppEmitter::BT_BEG_END            ; }
        else if ( strcmp( style, "C_STR"               ) == 0 ) { ce.buffer_type = CppEmitter::BT_C_STR              ; }
        else { std::cerr << "Unknown parse style ( " << style << " ). Possible values are HPIPE_BUFFER, BEG_END or C_STR" << std::endl; return 1; }

        ce.read( &ig );

        // output/test
        if ( benchmark )
            ce.bench( lexer.training_data() );

        if ( test )
            return ce.test( lexer.test_data() );

        if ( benchmark )
            return 0;

        StreamSepMaker ss( std::cout );
        std::ofstream fout;
        if ( output ) {
            fout.open( output );
            ss.stream = &fout;
        }

        ss << "// ----------------------------------------------------------------------------------------------------";
        ss << "#ifdef HPIPE_PRELIMINARIES";
        ce.write_preliminaries( ss );
        ss << "#endif // HPIPE_PRELIMINARIES";
        ss << "";

        ss << "// ----------------------------------------------------------------------------------------------------";
        ss << "#ifdef HPIPE_DECLARATIONS";
        ce.write_declarations( ss );
        ss << "#endif // HPIPE_DECLARATIONS";
        ss << "";

        ss << "// ----------------------------------------------------------------------------------------------------";
        ss << "#ifdef HPIPE_DEFINITIONS";
        ce.write_definitions( ss );
        ss << "#endif // HPIPE_DEFINITIONS";

        return 0;
    } catch ( const char *msg ) {
        std::cerr << msg << std::endl;
        return 1;
    }
}